

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O3

void update_stuff(player *p)

{
  uint32_t *puVar1;
  byte *pbVar2;
  wchar_t *pwVar3;
  bitflag *flags;
  byte bVar4;
  byte bVar5;
  wchar_t wVar6;
  player *p_00;
  bool bVar7;
  undefined1 auVar8 [16];
  _Bool _Var9;
  _Bool _Var10;
  int iVar11;
  wchar_t wVar12;
  object *poVar13;
  class_spell *pcVar14;
  magic_realm *pmVar15;
  player_upkeep *ppVar16;
  uint uVar17;
  wchar_t wVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  magic_realm *p_01;
  char *pcVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  player_state_conflict state;
  player_state_conflict known_state;
  short local_2b0;
  player_state_conflict local_2a8;
  player_state_conflict local_16c;
  
  ppVar16 = p->upkeep;
  uVar17 = ppVar16->update;
  if (uVar17 == 0) {
    return;
  }
  if ((uVar17 >> 10 & 1) != 0) {
    ppVar16->update = uVar17 & 0xfffffbff;
    calc_inventory(p);
    ppVar16 = p->upkeep;
    uVar17 = ppVar16->update;
  }
  if ((uVar17 & 1) == 0) goto LAB_001b8915;
  ppVar16->update = uVar17 & 0xfffffffe;
  memcpy(&local_2a8,&p->state,0x13c);
  memcpy(&local_16c,&p->known_state,0x13c);
  lVar25 = 0;
  calc_bonuses(p,&local_2a8,false,true);
  calc_bonuses(p,&local_16c,true,true);
  do {
    if (*(int *)((long)local_2a8.stat_top + lVar25) != *(int *)((long)(p->state).stat_top + lVar25))
    {
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 | 0x10;
    }
    if (*(int *)((long)local_2a8.stat_use + lVar25) != *(int *)((long)(p->state).stat_use + lVar25))
    {
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 | 0x10;
    }
    if (*(int *)((long)local_2a8.stat_ind + lVar25) != *(int *)((long)(p->state).stat_ind + lVar25))
    {
      uVar17 = p->upkeep->update;
      uVar19 = uVar17 | 4;
      if (lVar25 != 0x10) {
        uVar19 = uVar17;
      }
      p->upkeep->update = uVar19 | 0x18;
    }
    lVar25 = lVar25 + 4;
  } while (lVar25 != 0x14);
  _Var9 = flag_has_dbg(local_2a8.flags,6,0xd,"state.flags","OF_TELEPATHY");
  flags = (p->state).flags;
  _Var10 = flag_has_dbg(flags,6,0xd,"p->state.flags","OF_TELEPATHY");
  if (_Var9 != _Var10) {
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 0x80;
  }
  _Var9 = flag_has_dbg(local_2a8.flags,6,0xe,"state.flags","OF_SEE_INVIS");
  _Var10 = flag_has_dbg(flags,6,0xe,"p->state.flags","OF_SEE_INVIS");
  if (_Var9 != _Var10) {
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 0x80;
  }
  if (local_2a8.speed != (p->state).speed) {
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x400;
  }
  if (local_16c.ac == (p->known_state).ac) {
    ppVar16 = p->upkeep;
    if (local_16c.to_a != (p->known_state).to_a) goto LAB_001b8768;
  }
  else {
    ppVar16 = p->upkeep;
LAB_001b8768:
    *(byte *)&ppVar16->redraw = (byte)ppVar16->redraw | 0x20;
  }
  if ((p->state).cur_light != local_2a8.cur_light) {
    *(byte *)&ppVar16->update = (byte)ppVar16->update | 0xc0;
  }
  if (adj_str_wgt[(p->state).stat_ind[0]] != adj_str_wgt[local_2a8.stat_ind[0]]) {
    pbVar2 = (byte *)((long)&ppVar16->redraw + 2);
    *pbVar2 = *pbVar2 | 2;
  }
  if (ppVar16->only_partial == false) {
    if ((p->state).heavy_shoot != local_2a8.heavy_shoot) {
      if (local_2a8.heavy_shoot == false) {
        poVar13 = equipped_item_by_slot_name(p,"shooting");
        pcVar22 = "You have no trouble wielding your bow.";
        if (poVar13 == (object *)0x0) {
          pcVar22 = "You feel relieved to put down your heavy bow.";
        }
      }
      else {
        pcVar22 = "You have trouble wielding such a heavy bow.";
      }
      msg(pcVar22);
    }
    if ((p->state).heavy_wield != local_2a8.heavy_wield) {
      if (local_2a8.heavy_wield == false) {
        poVar13 = equipped_item_by_slot_name(p,"weapon");
        pcVar22 = "You have no trouble wielding your weapon.";
        if (poVar13 == (object *)0x0) {
          pcVar22 = "You feel relieved to put down your heavy weapon.";
        }
      }
      else {
        pcVar22 = "You have trouble wielding such a heavy weapon.";
      }
      msg(pcVar22);
    }
    if ((p->state).bless_wield != local_2a8.bless_wield) {
      if (local_2a8.bless_wield == false) {
        poVar13 = equipped_item_by_slot_name(p,"weapon");
        if (poVar13 == (object *)0x0) goto LAB_001b8874;
        pcVar22 = "You feel less attuned to your weapon.";
      }
      else {
        pcVar22 = "You feel attuned to your weapon.";
      }
      msg(pcVar22);
    }
LAB_001b8874:
    if ((p->state).cumber_armor != local_2a8.cumber_armor) {
      pcVar22 = "You feel able to move more freely.";
      if (local_2a8.cumber_armor != false) {
        pcVar22 = "The weight of your armor encumbers your movement.";
      }
      msg(pcVar22);
    }
    if (((p->state).shield_on_back != local_2a8.shield_on_back) &&
       (poVar13 = equipped_item_by_slot_name(p,"arm"), poVar13 != (object *)0x0)) {
      pcVar22 = "You are carrying your shield in your hand.";
      if (local_2a8.shield_on_back != false) {
        pcVar22 = "You are carrying your shield on your back.";
      }
      msg(pcVar22);
    }
  }
  memcpy(&p->state,&local_2a8,0x13c);
  memcpy(&p->known_state,&local_16c,0x13c);
  ppVar16 = p->upkeep;
  uVar17 = ppVar16->update;
LAB_001b8915:
  if ((uVar17 & 2) != 0) {
    ppVar16->update = uVar17 & 0xfffffffd;
    calc_light(p,&p->state,true);
    ppVar16 = p->upkeep;
    uVar17 = ppVar16->update;
  }
  if ((uVar17 & 4) != 0) {
    ppVar16->update = uVar17 & 0xfffffffb;
    iVar11 = (int)p->lev;
    auVar8 = SEXT816((long)adj_con_mhp[(p->state).stat_ind[4]] * (long)iVar11) *
             ZEXT816(0xa3d70a3d70a3d70b);
    iVar20 = ((int)(auVar8._8_8_ >> 6) - (auVar8._12_4_ >> 0x1f)) +
             (int)p->player_hp[(long)iVar11 + -1];
    iVar24 = iVar11 + 1;
    if (iVar11 < iVar20) {
      iVar24 = iVar20;
    }
    _Var9 = flag_has_dbg((p->state).pflags,10,0x48,"p->state.pflags","(PF_ATHLETICS)");
    if (_Var9) {
      iVar24 = iVar24 + iVar24 / 0x14;
    }
    if (iVar24 == p->mhp) {
      ppVar16 = p->upkeep;
    }
    else {
      p->mhp = (int16_t)iVar24;
      if (iVar24 <= p->chp) {
        p->chp = (int16_t)iVar24;
        p->chp_frac = 0;
      }
      ppVar16 = p->upkeep;
      ppVar16->redraw = ppVar16->redraw | 0x40;
    }
  }
  uVar17 = ppVar16->update;
  if ((uVar17 & 8) != 0) {
    ppVar16->update = uVar17 & 0xfffffff7;
    calc_mana(p,&p->state,true);
    ppVar16 = p->upkeep;
    uVar17 = ppVar16->update;
  }
  if ((uVar17 & 0x10) != 0) {
    ppVar16->update = uVar17 & 0xffffffef;
    p_00 = (player *)p->class;
    iVar24 = *(int *)(p_00->died_from + 0x3e);
    lVar25 = (long)iVar24;
    if (((0 < lVar25) && (character_generated == true)) && (ppVar16->only_partial == false)) {
      wVar6 = ppVar16->new_spells;
      iVar20 = (int)p->lev - *(int *)(p_00->died_from + 0x26);
      iVar11 = -1;
      if (-1 < iVar20) {
        iVar11 = iVar20;
      }
      wVar12 = average_spell_stat(p_00,&p->state);
      lVar21 = 0;
      iVar20 = 0;
      do {
        iVar20 = iVar20 + (p->spell_flags[lVar21] & 1);
        lVar21 = lVar21 + 1;
      } while (lVar25 != lVar21);
      p->upkeep->new_spells = ((iVar11 + 1) * adj_mag_study[wVar12] + 0x32) / 100 - iVar20;
      uVar23 = (ulong)(iVar24 - 1);
      lVar21 = uVar23 + 1;
      do {
        bVar4 = p->spell_order[lVar21 + -1];
        if ((bVar4 < 99) && (pcVar14 = spell_by_index(p,(uint)bVar4), (int)p->lev < pcVar14->slevel)
           ) {
          bVar5 = p->spell_flags[bVar4];
          if ((bVar5 & 1) != 0) {
            p->spell_flags[bVar4] = bVar5 | 4;
            p->spell_flags[bVar4] = p->spell_flags[bVar4] & 0xfe;
            msg("You have forgotten the %s of %s.",pcVar14->realm->spell_noun,pcVar14->name);
            pwVar3 = &p->upkeep->new_spells;
            *pwVar3 = *pwVar3 + L'\x01';
          }
        }
        lVar26 = lVar21 + -1;
        bVar7 = 0 < lVar21;
        lVar21 = lVar26;
      } while (lVar26 != 0 && bVar7);
      lVar21 = uVar23 + 1;
      do {
        if (L'\xffffffff' < p->upkeep->new_spells) break;
        bVar4 = p->spell_order[lVar21 + -1];
        if (bVar4 < 99) {
          pcVar14 = spell_by_index(p,(uint)bVar4);
          bVar5 = p->spell_flags[bVar4];
          if ((bVar5 & 1) != 0) {
            p->spell_flags[bVar4] = bVar5 | 4;
            p->spell_flags[bVar4] = p->spell_flags[bVar4] & 0xfe;
            msg("You have forgotten the %s of %s.",pcVar14->realm->spell_noun,pcVar14->name);
            pwVar3 = &p->upkeep->new_spells;
            *pwVar3 = *pwVar3 + L'\x01';
          }
        }
        lVar26 = lVar21 + -1;
        bVar7 = 0 < lVar21;
        lVar21 = lVar26;
      } while (lVar26 != 0 && bVar7);
      lVar21 = 0;
      do {
        if (p->upkeep->new_spells < L'\x01') break;
        bVar4 = p->spell_order[lVar21];
        if (0x62 < bVar4) break;
        pcVar14 = spell_by_index(p,(uint)bVar4);
        if (pcVar14->slevel <= (int)p->lev) {
          bVar5 = p->spell_flags[bVar4];
          if ((bVar5 & 4) != 0) {
            p->spell_flags[bVar4] = bVar5 & 0xfb;
            p->spell_flags[bVar4] = p->spell_flags[bVar4] | 1;
            msg("You have remembered the %s of %s.",pcVar14->realm->spell_noun,pcVar14->name);
            pwVar3 = &p->upkeep->new_spells;
            *pwVar3 = *pwVar3 + L'\xffffffff';
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar25 != lVar21);
      lVar21 = 0;
      wVar12 = L'\0';
      do {
        pcVar14 = spell_by_index(p,(wchar_t)lVar21);
        if (((pcVar14 != (class_spell *)0x0) && (pcVar14->slevel != L'\0')) &&
           (pcVar14->slevel <= (int)p->lev)) {
          wVar12 = wVar12 + (~(uint)p->spell_flags[lVar21] & 1);
        }
        lVar21 = lVar21 + 1;
      } while (lVar25 != lVar21);
      ppVar16 = p->upkeep;
      wVar18 = ppVar16->new_spells;
      if (wVar12 < ppVar16->new_spells) {
        ppVar16->new_spells = wVar12;
        wVar18 = wVar12;
      }
      local_2b0 = (short)wVar6;
      if (local_2b0 != wVar18) {
        if (wVar18 != L'\0') {
          pmVar15 = class_magic_realms(p->class,local_16c.stat_add);
          my_strcpy((char *)&local_2a8,pmVar15->spell_noun,0x78);
          if (L'\x01' < p->upkeep->new_spells) {
            my_strcat((char *)&local_2a8,"s",0x78);
          }
          p_01 = pmVar15->next;
          mem_free(pmVar15);
          if (p_01 != (magic_realm *)0x0 && 1 < local_16c.stat_add[0]) {
            do {
              local_16c.stat_add[0] = local_16c.stat_add[0] + -1;
              pcVar22 = " or ";
              if (local_16c.stat_add[0] != 0) {
                pcVar22 = ", ";
              }
              my_strcat((char *)&local_2a8,pcVar22,0x78);
              my_strcat((char *)&local_2a8,p_01->spell_noun,0x78);
              if (L'\x01' < p->upkeep->new_spells) {
                my_strcat((char *)&local_2a8,"s",0x78);
              }
              pmVar15 = p_01->next;
              mem_free(p_01);
              p_01 = pmVar15;
            } while (pmVar15 != (magic_realm *)0x0);
          }
          msg("You can learn %d more %s.",(ulong)(uint)p->upkeep->new_spells,&local_2a8);
          ppVar16 = p->upkeep;
        }
        ppVar16->redraw = ppVar16->redraw | 0x200800;
      }
    }
  }
  if ((ppVar16->update & 0x20) != 0) {
    ppVar16->update = ppVar16->update & 0xffffffdf;
    calc_specialty(p);
  }
  if ((character_generated == true) && (_Var9 = map_is_visible(), _Var9)) {
    ppVar16 = p->upkeep;
    uVar17 = ppVar16->update;
    if ((uVar17 & 0x40) != 0) {
      ppVar16->update = uVar17 & 0xffffffbf;
      update_view(cave,p);
      ppVar16 = p->upkeep;
      uVar17 = ppVar16->update;
    }
    if ((uVar17 >> 8 & 1) != 0) {
      ppVar16->update = uVar17 & 0xfffffe7f;
      update_monsters(true);
      ppVar16 = p->upkeep;
      uVar17 = ppVar16->update;
    }
    if ((char)uVar17 < '\0') {
      ppVar16->update = uVar17 & 0xffffff7f;
      update_monsters(false);
      ppVar16 = p->upkeep;
      uVar17 = ppVar16->update;
    }
    if ((uVar17 >> 9 & 1) != 0) {
      ppVar16->update = uVar17 & 0xfffffdff;
      event_signal(EVENT_PLAYERMOVED);
    }
  }
  return;
}

Assistant:

void update_stuff(struct player *p)
{
	/* Update stuff */
	if (!p->upkeep->update) return;


	if (p->upkeep->update & (PU_INVEN)) {
		p->upkeep->update &= ~(PU_INVEN);
		calc_inventory(p);
	}

	if (p->upkeep->update & (PU_BONUS)) {
		p->upkeep->update &= ~(PU_BONUS);
		update_bonuses(p);
	}

	if (p->upkeep->update & (PU_TORCH)) {
		p->upkeep->update &= ~(PU_TORCH);
		calc_light(p, &p->state, true);
	}

	if (p->upkeep->update & (PU_HP)) {
		p->upkeep->update &= ~(PU_HP);
		calc_hitpoints(p);
	}

	if (p->upkeep->update & (PU_MANA)) {
		p->upkeep->update &= ~(PU_MANA);
		calc_mana(p, &p->state, true);
	}

	if (p->upkeep->update & (PU_SPELLS)) {
		p->upkeep->update &= ~(PU_SPELLS);
		if (p->class->magic.total_spells > 0) {
			calc_spells(p);
		}
	}

	if (p->upkeep->update & (PU_SPECIALTY)) {
		p->upkeep->update &= ~(PU_SPECIALTY);
		calc_specialty(p);
	}

	/* Character is not ready yet, no map updates */
	if (!character_generated) return;

	/* Map is not shown, no map updates */
	if (!map_is_visible()) return;

	if (p->upkeep->update & (PU_UPDATE_VIEW)) {
		p->upkeep->update &= ~(PU_UPDATE_VIEW);
		update_view(cave, p);
	}

	if (p->upkeep->update & (PU_DISTANCE)) {
		p->upkeep->update &= ~(PU_DISTANCE);
		p->upkeep->update &= ~(PU_MONSTERS);
		update_monsters(true);
	}

	if (p->upkeep->update & (PU_MONSTERS)) {
		p->upkeep->update &= ~(PU_MONSTERS);
		update_monsters(false);
	}


	if (p->upkeep->update & (PU_PANEL)) {
		p->upkeep->update &= ~(PU_PANEL);
		event_signal(EVENT_PLAYERMOVED);
	}
}